

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript_tests.cpp
# Opt level: O0

set<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::less<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
* anon_unknown.dwarf_6f47f7::FindChallenges(NodeRef *ref)

{
  _Rb_tree_const_iterator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_> __first;
  bool bVar1;
  element_type *peVar2;
  set<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::less<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
  *in_RDI;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_const_iterator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>,_bool>
  pVar3;
  shared_ptr<const_miniscript::Node<CPubKey>_> *sub;
  vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
  *__range1_1;
  CPubKey *key;
  vector<CPubKey,_std::allocator<CPubKey>_> *__range1;
  set<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::less<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
  *chal;
  iterator __end1_1;
  iterator __begin1_1;
  const_iterator __end1;
  const_iterator __begin1;
  set<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::less<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
  sub_chal;
  __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_fffffffffffffe18;
  set<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::less<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
  *in_stack_fffffffffffffe20;
  undefined7 in_stack_fffffffffffffe28;
  undefined1 in_stack_fffffffffffffe2f;
  _Rb_tree_const_iterator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>
  in_stack_fffffffffffffe30;
  uint32_t in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe3c;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 uVar4;
  set<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::less<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
  local_38;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = 0;
  std::
  set<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::less<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
  ::set((set<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::less<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
         *)in_stack_fffffffffffffe18);
  std::
  __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->(in_stack_fffffffffffffe18);
  std::vector<CPubKey,_std::allocator<CPubKey>_>::begin
            ((vector<CPubKey,_std::allocator<CPubKey>_> *)in_stack_fffffffffffffe20);
  std::vector<CPubKey,_std::allocator<CPubKey>_>::end
            ((vector<CPubKey,_std::allocator<CPubKey>_> *)in_stack_fffffffffffffe20);
  while (bVar1 = __gnu_cxx::
                 operator==<const_CPubKey_*,_std::vector<CPubKey,_std::allocator<CPubKey>_>_>
                           ((__normal_iterator<const_CPubKey_*,_std::vector<CPubKey,_std::allocator<CPubKey>_>_>
                             *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28),
                            (__normal_iterator<const_CPubKey_*,_std::vector<CPubKey,_std::allocator<CPubKey>_>_>
                             *)in_stack_fffffffffffffe20), ((bVar1 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::__normal_iterator<const_CPubKey_*,_std::vector<CPubKey,_std::allocator<CPubKey>_>_>::
    operator*((__normal_iterator<const_CPubKey_*,_std::vector<CPubKey,_std::allocator<CPubKey>_>_> *
              )in_stack_fffffffffffffe18);
    ChallengeNumber((CPubKey *)in_stack_fffffffffffffe18);
    std::
    set<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>,std::less<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>,std::allocator<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>>
    ::emplace<(anonymous_namespace)::ChallengeType,unsigned_int>
              ((set<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::less<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
                *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
               &(in_stack_fffffffffffffe30._M_node)->_M_color,
               (uint *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28));
    __gnu_cxx::__normal_iterator<const_CPubKey_*,_std::vector<CPubKey,_std::allocator<CPubKey>_>_>::
    operator++((__normal_iterator<const_CPubKey_*,_std::vector<CPubKey,_std::allocator<CPubKey>_>_>
                *)in_stack_fffffffffffffe18);
  }
  peVar2 = std::
           __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->(in_stack_fffffffffffffe18);
  if (peVar2->fragment == OLDER) {
    std::
    __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->(in_stack_fffffffffffffe18);
    std::
    set<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>,std::less<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>,std::allocator<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>>
    ::emplace<(anonymous_namespace)::ChallengeType,unsigned_int_const&>
              ((set<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::less<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
                *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
               &(in_stack_fffffffffffffe30._M_node)->_M_color,
               (uint *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28));
  }
  else {
    peVar2 = std::
             __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(in_stack_fffffffffffffe18);
    if (peVar2->fragment == AFTER) {
      std::
      __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->(in_stack_fffffffffffffe18);
      std::
      set<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>,std::less<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>,std::allocator<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>>
      ::emplace<(anonymous_namespace)::ChallengeType,unsigned_int_const&>
                ((set<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::less<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
                  *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                 &(in_stack_fffffffffffffe30._M_node)->_M_color,
                 (uint *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28));
    }
    else {
      peVar2 = std::
               __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(in_stack_fffffffffffffe18);
      if (peVar2->fragment == SHA256) {
        std::
        __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->(in_stack_fffffffffffffe18);
        ChallengeNumber((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        in_stack_fffffffffffffe18);
        std::
        set<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>,std::less<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>,std::allocator<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>>
        ::emplace<(anonymous_namespace)::ChallengeType,unsigned_int>
                  ((set<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::less<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
                    *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                   &(in_stack_fffffffffffffe30._M_node)->_M_color,
                   (uint *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28));
      }
      else {
        peVar2 = std::
                 __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->(in_stack_fffffffffffffe18);
        if (peVar2->fragment == RIPEMD160) {
          std::
          __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->(in_stack_fffffffffffffe18);
          ChallengeNumber((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                          in_stack_fffffffffffffe18);
          std::
          set<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>,std::less<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>,std::allocator<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>>
          ::emplace<(anonymous_namespace)::ChallengeType,unsigned_int>
                    ((set<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::less<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
                      *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                     &(in_stack_fffffffffffffe30._M_node)->_M_color,
                     (uint *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28));
        }
        else {
          peVar2 = std::
                   __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->(in_stack_fffffffffffffe18);
          if (peVar2->fragment == HASH256) {
            std::
            __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->(in_stack_fffffffffffffe18);
            ChallengeNumber((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                            in_stack_fffffffffffffe18);
            pVar3 = std::
                    set<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>,std::less<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>,std::allocator<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>>
                    ::emplace<(anonymous_namespace)::ChallengeType,unsigned_int>
                              ((set<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::less<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
                                *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                               &(in_stack_fffffffffffffe30._M_node)->_M_color,
                               (uint *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28)
                              );
            in_stack_fffffffffffffe3c = CONCAT13(pVar3.second,(int3)in_stack_fffffffffffffe3c);
          }
          else {
            peVar2 = std::
                     __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->(in_stack_fffffffffffffe18);
            if (peVar2->fragment == HASH160) {
              std::
              __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->(in_stack_fffffffffffffe18);
              in_stack_fffffffffffffe38 =
                   ChallengeNumber((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   in_stack_fffffffffffffe18);
              pVar3 = std::
                      set<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>,std::less<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>,std::allocator<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>>
                      ::emplace<(anonymous_namespace)::ChallengeType,unsigned_int>
                                ((set<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::less<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
                                  *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                                 &(in_stack_fffffffffffffe30._M_node)->_M_color,
                                 (uint *)CONCAT17(in_stack_fffffffffffffe2f,
                                                  in_stack_fffffffffffffe28));
              in_stack_fffffffffffffe30 = pVar3.first._M_node;
              in_stack_fffffffffffffe2f = pVar3.second;
            }
          }
        }
      }
    }
  }
  std::
  __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->(in_stack_fffffffffffffe18);
  std::
  vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
  ::begin((vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
           *)in_stack_fffffffffffffe20);
  std::
  vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
  ::end((vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
         *)in_stack_fffffffffffffe20);
  while (bVar1 = __gnu_cxx::
                 operator==<std::shared_ptr<const_miniscript::Node<CPubKey>_>_*,_std::vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>_>
                           ((__normal_iterator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_*,_std::vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>_>
                             *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28),
                            (__normal_iterator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_*,_std::vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>_>
                             *)in_stack_fffffffffffffe20), ((bVar1 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_*,_std::vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>_>
    ::operator*((__normal_iterator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_*,_std::vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>_>
                 *)in_stack_fffffffffffffe18);
    FindChallenges((NodeRef *)CONCAT17(uVar4,in_stack_fffffffffffffef0));
    in_stack_fffffffffffffe20 = &local_38;
    std::
    set<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::less<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
    ::begin(in_stack_fffffffffffffe20);
    std::
    set<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::less<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
    ::end(in_stack_fffffffffffffe20);
    __first._M_node._4_4_ = in_stack_fffffffffffffe3c;
    __first._M_node._0_4_ = in_stack_fffffffffffffe38;
    std::
    set<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>,std::less<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>,std::allocator<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>>
    ::
    insert<std::_Rb_tree_const_iterator<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>>
              ((set<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::less<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
                *)in_stack_fffffffffffffe18,__first,in_stack_fffffffffffffe30);
    std::
    set<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::less<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
    ::~set((set<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::less<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
            *)in_stack_fffffffffffffe18);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_*,_std::vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>_>
    ::operator++((__normal_iterator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_*,_std::vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>_>
                  *)in_stack_fffffffffffffe18);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::set<Challenge> FindChallenges(const NodeRef& ref) {
    std::set<Challenge> chal;
    for (const auto& key : ref->keys) {
        chal.emplace(ChallengeType::PK, ChallengeNumber(key));
    }
    if (ref->fragment == miniscript::Fragment::OLDER) {
        chal.emplace(ChallengeType::OLDER, ref->k);
    } else if (ref->fragment == miniscript::Fragment::AFTER) {
        chal.emplace(ChallengeType::AFTER, ref->k);
    } else if (ref->fragment == miniscript::Fragment::SHA256) {
        chal.emplace(ChallengeType::SHA256, ChallengeNumber(ref->data));
    } else if (ref->fragment == miniscript::Fragment::RIPEMD160) {
        chal.emplace(ChallengeType::RIPEMD160, ChallengeNumber(ref->data));
    } else if (ref->fragment == miniscript::Fragment::HASH256) {
        chal.emplace(ChallengeType::HASH256, ChallengeNumber(ref->data));
    } else if (ref->fragment == miniscript::Fragment::HASH160) {
        chal.emplace(ChallengeType::HASH160, ChallengeNumber(ref->data));
    }
    for (const auto& sub : ref->subs) {
        auto sub_chal = FindChallenges(sub);
        chal.insert(sub_chal.begin(), sub_chal.end());
    }
    return chal;
}